

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

long duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<duckdb::hugeint_t,long>
               (hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  hugeint_t input_00;
  bool bVar1;
  int64_t in_RDI;
  long result_value;
  VectorDecimalCastData *data;
  VectorTryCastData *in_stack_ffffffffffffff68;
  allocator *idx_00;
  ValidityMask *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [6];
  uint8_t in_stack_ffffffffffffff96;
  uint8_t in_stack_ffffffffffffff97;
  CastParameters *in_stack_ffffffffffffff98;
  int64_t *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  long local_40;
  long local_8;
  
  input_00.upper = in_RDI;
  input_00.lower = in_stack_ffffffffffffffa8;
  bVar1 = TryCastToDecimal::Operation<duckdb::hugeint_t,long>
                    (input_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff97,in_stack_ffffffffffffff96);
  if (bVar1) {
    local_8 = local_40;
  }
  else {
    idx_00 = &local_71;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_70,"Failed to cast decimal value",idx_00);
    local_8 = HandleVectorCastError::Operation<long>
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(idx_t)idx_00,
                         in_stack_ffffffffffffff68);
    ::std::__cxx11::string::~string(local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return local_8;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}